

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt8x16OperationX86X64.cpp
# Opt level: O2

SIMDValue Js::SIMDInt8x16Operation::OpShiftLeftByScalar(SIMDValue *value,int count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar2 = psllw(_DAT_00f60370 & (undefined1  [16])value->field_0,ZEXT416(count & 7));
  auVar1 = psllw((undefined1  [16])value->field_0,ZEXT416(count & 7));
  return (SIMDValue)(anon_union_16_9_4d7543c8_for__SIMDValue_0)(auVar1 & _DAT_00f60360 | auVar2);
}

Assistant:

SIMDValue SIMDInt8x16Operation::OpShiftLeftByScalar(const SIMDValue& value, int count)
    {
        X86SIMDValue x86Result;
        X86SIMDValue tmpaValue = X86SIMDValue::ToX86SIMDValue(value);
        X86SIMDValue x86tmp1;

        count = count & SIMDUtils::SIMDGetShiftAmountMask(1);

        x86tmp1.m128i_value = _mm_and_si128(tmpaValue.m128i_value, X86_HIGHBYTES_MASK.m128i_value);
        x86tmp1.m128i_value = _mm_slli_epi16(x86tmp1.m128i_value, count);

        tmpaValue.m128i_value = _mm_slli_epi16(tmpaValue.m128i_value, count);
        tmpaValue.m128i_value = _mm_and_si128(tmpaValue.m128i_value, X86_LOWBYTES_MASK.m128i_value);

        x86Result.m128i_value = _mm_or_si128(tmpaValue.m128i_value, x86tmp1.m128i_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }